

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

void free_handshake_space(st_quicly_handshake_space_t **space)

{
  ptls_aead_context_t *ppVar1;
  st_quicly_handshake_space_t *space_00;
  
  space_00 = *space;
  if (space_00 != (st_quicly_handshake_space_t *)0x0) {
    ppVar1 = (space_00->cipher).ingress.aead;
    if (ppVar1 != (ptls_aead_context_t *)0x0) {
      ptls_aead_free(ppVar1);
      ptls_cipher_free((space_00->cipher).ingress.header_protection);
      space_00 = *space;
    }
    ppVar1 = (space_00->cipher).egress.aead;
    if (ppVar1 != (ptls_aead_context_t *)0x0) {
      ptls_aead_free(ppVar1);
      ptls_cipher_free((space_00->cipher).egress.header_protection);
      space_00 = *space;
    }
    do_free_pn_space(&space_00->super);
    *space = (st_quicly_handshake_space_t *)0x0;
  }
  return;
}

Assistant:

static void free_handshake_space(struct st_quicly_handshake_space_t **space)
{
    if (*space != NULL) {
        if ((*space)->cipher.ingress.aead != NULL)
            dispose_cipher(&(*space)->cipher.ingress);
        if ((*space)->cipher.egress.aead != NULL)
            dispose_cipher(&(*space)->cipher.egress);
        do_free_pn_space(&(*space)->super);
        *space = NULL;
    }
}